

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O1

void __thiscall
nv::DirectDrawSurface::mipmap(DirectDrawSurface *this,Image *img,uint face,uint mipmap)

{
  uint uVar1;
  Stream *pSVar2;
  uint uVar3;
  uint h;
  uint w;
  
  pSVar2 = this->stream;
  uVar3 = offset(this,face,mipmap);
  (*pSVar2->_vptr_Stream[3])(pSVar2,(ulong)uVar3);
  uVar1 = (this->header).flags;
  h = 1;
  w = 1;
  if ((uVar1 & 4) != 0) {
    w = (this->header).width;
  }
  if ((uVar1 & 2) != 0) {
    h = (this->header).height;
  }
  if (mipmap != 0) {
    do {
      w = (w >> 1) + (uint)(w >> 1 == 0);
      h = (h >> 1) + (uint)(h >> 1 == 0);
      mipmap = mipmap - 1;
    } while (mipmap != 0);
  }
  Image::allocate(img,w,h);
  uVar1 = (this->header).pf.flags;
  if ((uVar1 & 0x40) == 0) {
    if ((uVar1 & 4) == 0) {
      return;
    }
    readBlockImage(this,img);
    return;
  }
  readLinearImage(this,img);
  return;
}

Assistant:

void DirectDrawSurface::mipmap(Image * img, uint face, uint mipmap)
{
	nvDebugCheck(isValid());
	
	stream->seek(offset(face, mipmap));
	
	uint w = width();
	uint h = height();
	
	// Compute width and height.
	for (uint m = 0; m < mipmap; m++)
	{
		w = max(1U, w / 2);
		h = max(1U, h / 2);
	}
	
	img->allocate(w, h);
	
	if (header.pf.flags & DDPF_RGB) 
	{
		readLinearImage(img);
	}
	else if (header.pf.flags & DDPF_FOURCC)
	{
		readBlockImage(img);
	}
}